

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O3

void do_iaf_psc_cold_5(void)

{
  fwrite("Error: No image to update\n",0x1a,1,_stderr);
  return;
}

Assistant:

static int do_iaf_psc_update(int argc, char *argv[])
{
    const char *device_path = NULL;
    const char *image_path = NULL;

    if (argc <= 0)
    {
        fwupd_error("No image to update\n");
        return ERROR_BAD_ARGUMENT;
    }

    do
    {
        if (arg_is_quiet(argv[0]))
        {
            quiet = true;
            continue;
        }
        if (arg_is_device(argv[0]))
        {
            if (!arg_next(&argc, &argv))
            {
                fwupd_error("No device to update\n");
                return ERROR_BAD_ARGUMENT;
            }
            device_path = argv[0];
        }
        else if (arg_is_image(argv[0]))
        {
            if (!arg_next(&argc, &argv))
            {
                fwupd_error("No image to update\n");
                return ERROR_BAD_ARGUMENT;
            }
            image_path = argv[0];
        }
        else
        {
            fwupd_error("Wrong argument %s\n", argv[0]);
            return ERROR_BAD_ARGUMENT;
        }
    } while(arg_next(&argc, &argv));

    if (image_path)
    {
        return iaf_psc_update(device_path, image_path);
    }

    fwupd_error("No image to update\n");
    return ERROR_BAD_ARGUMENT;
}